

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptimeutilities.h
# Opt level: O2

RTPNTPTime __thiscall jrtplib::RTPTime::GetNTPTime(RTPTime *this)

{
  ulong uVar1;
  
  uVar1 = (ulong)this->m_t;
  return (RTPNTPTime)
         ((ulong)((int)uVar1 + 0x83aa7e80) |
         (long)(((double)((long)((this->m_t - (double)(uVar1 & 0xffffffff)) * 1000000.0) &
                         0xffffffff) / 1000000.0) * 4294967296.0) << 0x20);
}

Assistant:

inline RTPNTPTime RTPTime::GetNTPTime() const
{
	uint32_t sec = (uint32_t)m_t;
	uint32_t microsec = (uint32_t)((m_t - (double)sec)*1e6);

	uint32_t msw = sec+RTP_NTPTIMEOFFSET;
	uint32_t lsw;
	double x;
	
    x = microsec/1000000.0;
	x *= (65536.0*65536.0);
	lsw = (uint32_t)x;

	return RTPNTPTime(msw,lsw);
}